

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O1

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  uint *puVar1;
  cmMakefile *pcVar2;
  MessageType MVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pcVar8;
  cmake *pcVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  cmExecutionStatus status;
  string errorString;
  MessageType messType;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmListFileBacktrace bt;
  cmListFileContext conditionContext;
  cmConditionEvaluator conditionEvaluator;
  cmExecutionStatus local_1dc;
  cmMakefile *local_1d8;
  string local_1d0;
  cmExecutionStatus *local_1b0;
  MessageType local_1a4;
  cmMakefile *local_1a0;
  string local_198;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_178;
  string *local_160;
  cmListFileBacktrace local_158;
  cmListFileContext local_118;
  cmMakefile *local_d0;
  
  iVar5 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"if");
  if (iVar5 == 0) {
    this->ScopeDepth = this->ScopeDepth + 1;
  }
  else {
    iVar5 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endif")
    ;
    if (iVar5 == 0) {
      puVar1 = &this->ScopeDepth;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        local_1b0 = inStatus;
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&stack0xffffffffffffff30,(cmFunctionBlocker *)mf,
                   (cmListFileFunction *)this);
        bVar12 = local_d0 != (cmMakefile *)0x0;
        if (bVar12) {
          local_1a0 = local_d0;
          local_1dc.ReturnInvoked = false;
          local_1dc.BreakInvoked = false;
          local_1dc.ContinueInvoked = false;
          local_1dc.NestedError = false;
          pcVar8 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_1d8 = mf;
          if ((this->Functions).
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_finish != pcVar8) {
            local_160 = &(this->super_cmFunctionBlocker).StartingContext.FilePath;
            iVar5 = 0;
            uVar10 = 0;
            uVar11 = 1;
            do {
              iVar6 = cmsys::SystemTools::Strucmp
                                (pcVar8[uVar10].super_cmCommandContext.Name._M_dataplus._M_p,"if");
              iVar7 = cmsys::SystemTools::Strucmp
                                ((this->Functions).
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                 super_cmCommandContext.Name._M_dataplus._M_p,"endif");
              iVar5 = (iVar5 + (uint)(iVar6 == 0)) - (uint)(iVar7 == 0);
              if (iVar5 == 0) {
                iVar6 = cmsys::SystemTools::Strucmp
                                  ((this->Functions).
                                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                   super_cmCommandContext.Name._M_dataplus._M_p,"else");
                if (iVar6 == 0) {
                  bVar4 = this->HasRun;
                  this->IsBlocking = bVar4;
                  this->HasRun = true;
                  if ((bVar4 == false) &&
                     (pcVar9 = cmMakefile::GetCMakeInstance(local_1d8), pcVar9->Trace == true)) {
                    cmMakefile::PrintCommandTrace
                              (local_1d8,
                               (this->Functions).
                               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar10);
                  }
                }
                else {
                  iVar6 = cmsys::SystemTools::Strucmp
                                    ((this->Functions).
                                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                     super_cmCommandContext.Name._M_dataplus._M_p,"elseif");
                  if (iVar6 != 0) goto LAB_002b2132;
                  if (this->HasRun == true) {
                    this->IsBlocking = true;
                  }
                  else {
                    pcVar9 = cmMakefile::GetCMakeInstance(local_1d8);
                    if (pcVar9->Trace == true) {
                      cmMakefile::PrintCommandTrace
                                (local_1d8,
                                 (this->Functions).
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar10);
                    }
                    pcVar2 = local_1d8;
                    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                    local_1d0._M_string_length = 0;
                    local_1d0.field_2._M_local_buf[0] = '\0';
                    local_178.
                    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_178.
                    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_178.
                    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    cmMakefile::ExpandArguments
                              (local_1d8,
                               &(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].Arguments,
                               &local_178,(char *)0x0);
                    cmConditionEvaluator::GetConditionContext
                              (&local_118,pcVar2,
                               &(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                super_cmCommandContext,local_160);
                    cmMakefile::GetBacktrace
                              (&local_158,pcVar2,
                               &(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                super_cmCommandContext);
                    cmConditionEvaluator::cmConditionEvaluator
                              ((cmConditionEvaluator *)&stack0xffffffffffffff30,pcVar2,&local_118,
                               &local_158);
                    cmListFileBacktrace::~cmListFileBacktrace(&local_158);
                    bVar4 = cmConditionEvaluator::IsTrue
                                      ((cmConditionEvaluator *)&stack0xffffffffffffff30,&local_178,
                                       &local_1d0,&local_1a4);
                    if (local_1d0._M_string_length != 0) {
                      cmIfCommandError_abi_cxx11_(&local_198,&local_178);
                      std::__cxx11::string::_M_append
                                ((char *)&local_198,(ulong)local_1d0._M_dataplus._M_p);
                      pcVar2 = local_1d8;
                      cmMakefile::GetBacktrace
                                (&local_158,local_1d8,
                                 &(this->Functions).
                                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                  super_cmCommandContext);
                      pcVar9 = cmMakefile::GetCMakeInstance(pcVar2);
                      MVar3 = local_1a4;
                      cmake::IssueMessage(pcVar9,local_1a4,&local_198,&local_158,false);
                      if (MVar3 == FATAL_ERROR) {
                        cmSystemTools::s_FatalErrorOccured = true;
                        cmListFileBacktrace::~cmListFileBacktrace(&local_158);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_198._M_dataplus._M_p != &local_198.field_2) {
                          operator_delete(local_198._M_dataplus._M_p,
                                          local_198.field_2._M_allocated_capacity + 1);
                        }
                        cmConditionEvaluator::~cmConditionEvaluator
                                  ((cmConditionEvaluator *)&stack0xffffffffffffff30);
                        cmListFileContext::~cmListFileContext(&local_118);
                        std::
                        vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        ::~vector(&local_178);
                        local_d0 = local_1a0;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                          operator_delete(local_1d0._M_dataplus._M_p,
                                          CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                                                   local_1d0.field_2._M_local_buf[0]) + 1);
                          local_d0 = local_1a0;
                        }
                        break;
                      }
                      cmListFileBacktrace::~cmListFileBacktrace(&local_158);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_198._M_dataplus._M_p != &local_198.field_2) {
                        operator_delete(local_198._M_dataplus._M_p,
                                        local_198.field_2._M_allocated_capacity + 1);
                      }
                    }
                    if (bVar4) {
                      this->IsBlocking = false;
                      this->HasRun = true;
                    }
                    cmConditionEvaluator::~cmConditionEvaluator
                              ((cmConditionEvaluator *)&stack0xffffffffffffff30);
                    cmListFileContext::~cmListFileContext(&local_118);
                    std::
                    vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                    ~vector(&local_178);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                      operator_delete(local_1d0._M_dataplus._M_p,
                                      CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                                               local_1d0.field_2._M_local_buf[0]) + 1);
                    }
                  }
                }
              }
              else {
LAB_002b2132:
                if (this->IsBlocking == false) {
                  local_1dc.ReturnInvoked = false;
                  local_1dc.BreakInvoked = false;
                  local_1dc.ContinueInvoked = false;
                  local_1dc.NestedError = false;
                  cmMakefile::ExecuteCommand
                            (local_1d8,
                             (this->Functions).
                             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar10,&local_1dc);
                  local_d0 = local_1a0;
                  if (local_1dc.ReturnInvoked == true) {
                    local_1b0->ReturnInvoked = true;
                    break;
                  }
                  if (local_1dc.BreakInvoked == true) {
                    local_1b0->BreakInvoked = true;
                    break;
                  }
                  if (local_1dc.ContinueInvoked == true) {
                    local_1b0->ContinueInvoked = true;
                    break;
                  }
                }
              }
              pcVar8 = (this->Functions).
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              bVar4 = uVar11 < (ulong)((long)(this->Functions).
                                             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pcVar8 >> 6);
              local_d0 = local_1a0;
              uVar10 = uVar11;
              uVar11 = (ulong)((int)uVar11 + 1);
            } while (bVar4);
          }
        }
        if (local_d0 == (cmMakefile *)0x0) {
          return bVar12;
        }
        (**(code **)(*(long *)&(local_d0->CMP0054ReportedIds)._M_t._M_impl + 0x18))();
        return bVar12;
      }
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmIfFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff,
                  cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  // we start by recording all the functions
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"if"))
    {
    this->ScopeDepth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endif"))
    {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for(unsigned int c = 0; c < this->Functions.size(); ++c)
        {
        // keep track of scope depth
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"if"))
          {
          scopeDepth++;
          }
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"endif"))
          {
          scopeDepth--;
          }
        // watch for our state change
        if (scopeDepth == 0 &&
            !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"else"))
          {
          this->IsBlocking = this->HasRun;
          this->HasRun = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if(!this->IsBlocking && mf.GetCMakeInstance()->GetTrace())
            {
            mf.PrintCommandTrace(this->Functions[c]);
            }
          }
        else if (scopeDepth == 0 && !cmSystemTools::Strucmp
                 (this->Functions[c].Name.c_str(),"elseif"))
          {
          if (this->HasRun)
            {
            this->IsBlocking = true;
            }
          else
            {
            // if trace is enabled, print the evaluated "elseif" statement
            if(mf.GetCMakeInstance()->GetTrace())
              {
              mf.PrintCommandTrace(this->Functions[c]);
              }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(this->Functions[c].Arguments,
                               expandedArguments);

            cmake::MessageType messType;

            cmListFileContext conditionContext =
                cmConditionEvaluator::GetConditionContext(
                  &mf, this->Functions[c],
                  this->GetStartingContext().FilePath);

            cmConditionEvaluator conditionEvaluator(
                  mf, conditionContext,
                  mf.GetBacktrace(this->Functions[c]));

            bool isTrue = conditionEvaluator.IsTrue(
              expandedArguments, errorString, messType);

            if (!errorString.empty())
              {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == cmake::FATAL_ERROR)
                {
                cmSystemTools::SetFatalErrorOccured();
                return true;
                }
              }

            if (isTrue)
              {
              this->IsBlocking = false;
              this->HasRun = true;
              }
            }
          }

        // should we execute?
        else if (!this->IsBlocking)
          {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            return true;
            }
          if (status.GetBreakInvoked())
            {
            inStatus.SetBreakInvoked(true);
            return true;
            }
          if (status.GetContinueInvoked())
            {
            inStatus.SetContinueInvoked(true);
            return true;
            }
          }
        }
      return true;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}